

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall tinyusdz::MetaVariable::get_value<tinyusdz::Token>(MetaVariable *this,Token *dst)

{
  Token *pTVar1;
  Token *v;
  Token *dst_local;
  MetaVariable *this_local;
  
  if (dst == (Token *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pTVar1 = tinyusdz::value::Value::as<tinyusdz::Token>(&this->_value,false);
    if (pTVar1 == (Token *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      Token::operator=(dst,pTVar1);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *dst) const {
    if (!dst) {
      return false;
    }

    if (const T *v = _value.as<T>()) {
      (*dst) = *v;
      return true;
    }

    return false;
  }